

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O1

bool __thiscall OpenMD::RigidBody::getAtomVel(RigidBody *this,Vector3d *vel,uint index)

{
  undefined4 *puVar1;
  double dVar2;
  pointer pVVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint i_3;
  double *pdVar7;
  double *pdVar8;
  uint i_2;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint i;
  long lVar12;
  double *pdVar13;
  uint k;
  double (*__return_storage_ptr__) [3];
  ulong uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  Vector<double,_3U> result_2;
  Vector3d velRot;
  SquareMatrix3<double> result;
  SquareMatrix3<double> result_1;
  Mat3x3d skewMat;
  Mat3x3d I;
  double local_238 [3];
  Vector3d *local_220;
  double local_218 [4];
  double local_1f8 [10];
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  uint uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  double local_178 [4];
  double local_158 [10];
  double local_108;
  undefined1 auStack_100 [16];
  double dStack_f0;
  undefined8 local_e8;
  undefined1 auStack_e0 [16];
  double dStack_d0;
  undefined8 local_c8;
  double local_c0 [9];
  double local_78 [8];
  double local_38;
  
  uVar14 = (ulong)index;
  uVar11 = (long)(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar14 < uVar11) {
    local_218[0] = 0.0;
    local_218[1] = 0.0;
    lVar12 = 0;
    local_218[2] = 0.0;
    local_c8 = 0;
    dStack_d0 = 0.0;
    local_e8 = 0;
    auStack_e0 = ZEXT816(0);
    dStack_f0 = 0.0;
    local_108 = 0.0;
    auStack_100 = ZEXT816(0);
    pVVar3 = (this->refCoords_).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_178[2] = pVVar3[uVar14].super_Vector<double,_3U>.data_[2];
    pVVar3 = pVVar3 + uVar14;
    local_178[0] = (pVVar3->super_Vector<double,_3U>).data_[0];
    local_178[1] = (pVVar3->super_Vector<double,_3U>).data_[1];
    lVar10 = *(long *)((long)&(((this->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                              .angularMomentum.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (this->super_StuntDouble).storage_);
    lVar9 = (long)(this->super_StuntDouble).localIndex_;
    local_198 = *(undefined8 *)(lVar10 + 0x10 + lVar9 * 0x18);
    local_188 = (undefined4)local_198;
    uStack_190 = 0;
    uStack_184 = (uint)((ulong)local_198 >> 0x20) ^ 0x80000000;
    uStack_180 = 0;
    uStack_17c = 0x80000000;
    puVar1 = (undefined4 *)(lVar10 + lVar9 * 0x18);
    local_1a8 = *puVar1;
    uStack_1a4 = puVar1[1];
    uStack_1a0 = puVar1[2];
    uStack_19c = puVar1[3];
    local_220 = vel;
    (*(this->super_StuntDouble)._vptr_StuntDouble[5])(local_78,this);
    local_108 = 0.0;
    auVar6._8_4_ = uStack_1a0;
    auVar6._0_8_ = CONCAT44(uStack_1a4,local_1a8);
    auVar6._12_4_ = uStack_19c;
    auVar16._8_8_ = auVar6._8_8_ ^ 0x8000000000000000;
    auVar16._0_8_ = local_198;
    dStack_f0 = (double)CONCAT44(uStack_184,local_188) / local_38;
    uVar15 = (undefined4)((ulong)local_78[4] >> 0x20);
    auVar4._8_4_ = SUB84(local_78[4],0);
    auVar4._0_8_ = local_38;
    auVar4._12_4_ = uVar15;
    auStack_100 = divpd(auVar16,auVar4);
    local_e8 = 0;
    dStack_d0 = -(double)CONCAT44(uStack_1a4,local_1a8) / local_78[0];
    auVar5._8_4_ = SUB84(local_78[4],0);
    auVar5._0_8_ = local_78[0];
    auVar5._12_4_ = uVar15;
    auStack_e0 = divpd(auVar6,auVar5);
    local_c8 = 0;
    __return_storage_ptr__ = (double (*) [3])local_c0;
    StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,&this->super_StuntDouble);
    local_1f8[8] = 0.0;
    local_1f8[6] = 0.0;
    local_1f8[7] = 0.0;
    local_1f8[4] = 0.0;
    local_1f8[5] = 0.0;
    local_1f8[2] = 0.0;
    local_1f8[3] = 0.0;
    local_1f8[0] = 0.0;
    local_1f8[1] = 0.0;
    do {
      lVar10 = 0;
      pdVar8 = &local_108;
      do {
        dVar2 = local_1f8[lVar12 * 3 + lVar10];
        lVar9 = 0;
        pdVar7 = pdVar8;
        do {
          dVar2 = dVar2 + (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                          super_RectMatrix<double,_3U,_3U>).data_[0][lVar9] * *pdVar7;
          lVar9 = lVar9 + 1;
          pdVar7 = pdVar7 + 3;
        } while (lVar9 != 3);
        local_1f8[lVar12 * 3 + lVar10] = dVar2;
        lVar10 = lVar10 + 1;
        pdVar8 = pdVar8 + 1;
      } while (lVar10 != 3);
      lVar12 = lVar12 + 1;
      __return_storage_ptr__ = __return_storage_ptr__ + 1;
    } while (lVar12 != 3);
    pdVar7 = local_158;
    local_158[6] = 0.0;
    local_158[7] = 0.0;
    local_158[4] = 0.0;
    local_158[5] = 0.0;
    local_158[2] = 0.0;
    local_158[3] = 0.0;
    local_158[0] = 0.0;
    local_158[1] = 0.0;
    local_158[8] = 0.0;
    pdVar8 = local_1f8;
    lVar10 = 0;
    do {
      lVar9 = 0;
      pdVar13 = pdVar7;
      do {
        *pdVar13 = pdVar8[lVar9];
        lVar9 = lVar9 + 1;
        pdVar13 = pdVar13 + 3;
      } while (lVar9 != 3);
      lVar10 = lVar10 + 1;
      pdVar7 = pdVar7 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar10 != 3);
    local_238[0] = 0.0;
    local_238[1] = 0.0;
    local_238[2] = 0.0;
    pdVar8 = local_158;
    lVar10 = 0;
    do {
      dVar2 = local_238[lVar10];
      lVar9 = 0;
      do {
        dVar2 = dVar2 + pdVar8[lVar9] * local_178[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      local_238[lVar10] = dVar2;
      lVar10 = lVar10 + 1;
      pdVar8 = pdVar8 + 3;
    } while (lVar10 != 3);
    local_218[2] = local_238[2];
    local_218[0] = local_238[0];
    local_218[1] = local_238[1];
    lVar9 = (long)(this->super_StuntDouble).localIndex_;
    lVar10 = *(long *)((long)&(((this->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                              .velocity.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (this->super_StuntDouble).storage_);
    local_1f8[2] = (double)*(undefined8 *)(lVar10 + 0x10 + lVar9 * 0x18);
    pdVar8 = (double *)(lVar10 + lVar9 * 0x18);
    local_1f8[0] = *pdVar8;
    local_1f8[1] = pdVar8[1];
    local_158[0] = 0.0;
    local_158[1] = 0.0;
    local_158[2] = 0.0;
    lVar10 = 0;
    do {
      local_158[lVar10] = local_1f8[lVar10] + local_218[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    (local_220->super_Vector<double,_3U>).data_[2] = local_158[2];
    (local_220->super_Vector<double,_3U>).data_[0] = local_158[0];
    (local_220->super_Vector<double,_3U>).data_[1] = local_158[1];
  }
  else {
    snprintf(painCave.errMsg,2000,
             "Index %d is an invalid index, the current rigid body contains %zu atoms.\n",
             (ulong)index,uVar11);
    painCave.isFatal = 0;
    simError();
  }
  return uVar14 < uVar11;
}

Assistant:

bool RigidBody::getAtomVel(Vector3d& vel, unsigned int index) {
    // velRot = $(A\cdot skew(I^{-1}j))^{T}refCoor$

    if (index < atoms_.size()) {
      Vector3d velRot;
      Mat3x3d skewMat;
      ;
      Vector3d ref = refCoords_[index];
      Vector3d ji  = getJ();
      Mat3x3d I    = getI();

      skewMat(0, 0) = 0;
      skewMat(0, 1) = ji[2] / I(2, 2);
      skewMat(0, 2) = -ji[1] / I(1, 1);

      skewMat(1, 0) = -ji[2] / I(2, 2);
      skewMat(1, 1) = 0;
      skewMat(1, 2) = ji[0] / I(0, 0);

      skewMat(2, 0) = ji[1] / I(1, 1);
      skewMat(2, 1) = -ji[0] / I(0, 0);
      skewMat(2, 2) = 0;

      velRot = (getA() * skewMat).transpose() * ref;

      vel = getVel() + velRot;
      return true;

    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Index %d is an invalid index, the current rigid body contains %zu "
          "atoms.\n",
          index, atoms_.size());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }